

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

bool __thiscall Database::can_acquire(Database *this,DatabaseLock *newlock)

{
  bool bVar1;
  Database *this_00;
  DatabaseLock *oth;
  long in_RDI;
  type *task;
  type *k;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
  *__range1;
  unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false>
  local_28;
  long local_20;
  
  local_20 = in_RDI + 0xf8;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>_>_>
       ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return true;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
    ::operator*((_Node_const_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
                 *)0x13539b);
    this_00 = (Database *)
              std::
              get<0ul,unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>
                        ((pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>
                          *)0x1353aa);
    oth = (DatabaseLock *)
          std::get<1ul,unsigned_long_const,std::unique_ptr<TaskSpec,std::default_delete<TaskSpec>>>
                    ((pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>
                      *)0x1353b9);
    std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>::operator->
              ((unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_> *)0x1353c6);
    bVar1 = TaskSpec::has_lock(this_00,oth);
    if (bVar1) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<const_unsigned_long,_std::unique_ptr<TaskSpec,_std::default_delete<TaskSpec>_>_>,_false,_false>
                  *)this_00);
  }
  return false;
}

Assistant:

bool Database::can_acquire(const DatabaseLock &newlock) const {
    for (const auto &[k, task] : tasks) {
        if (task->has_lock(newlock)) {
            return false;
        }
    }
    return true;
}